

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutOracle.c
# Opt level: O0

void Cut_OracleFreeCuts(Cut_Oracle_t *p,int Node)

{
  Cut_Cut_t *Entry;
  Cut_Cut_t *local_40;
  Cut_Cut_t *local_38;
  Cut_Cut_t *local_30;
  Cut_Cut_t *pCut2;
  Cut_Cut_t *pCut;
  Cut_Cut_t *pList;
  int Node_local;
  Cut_Oracle_t *p_local;
  
  Entry = (Cut_Cut_t *)Vec_PtrEntry(p->vCutsNew,Node);
  if (Entry != (Cut_Cut_t *)0x0) {
    if (Entry == (Cut_Cut_t *)0x0) {
      local_38 = (Cut_Cut_t *)0x0;
    }
    else {
      local_38 = Entry->pNext;
    }
    local_30 = local_38;
    pCut2 = Entry;
    while (pCut2 != (Cut_Cut_t *)0x0) {
      Extra_MmFixedEntryRecycle(p->pMmCuts,(char *)pCut2);
      pCut2 = local_30;
      if (local_30 == (Cut_Cut_t *)0x0) {
        local_40 = (Cut_Cut_t *)0x0;
      }
      else {
        local_40 = local_30->pNext;
      }
      local_30 = local_40;
    }
    Vec_PtrWriteEntry(p->vCutsNew,Node,Entry);
  }
  return;
}

Assistant:

void Cut_OracleFreeCuts( Cut_Oracle_t * p, int Node )
{
    Cut_Cut_t * pList, * pCut, * pCut2;
    pList = (Cut_Cut_t *)Vec_PtrEntry( p->vCutsNew, Node );
    if ( pList == NULL )
        return;
    Cut_ListForEachCutSafe( pList, pCut, pCut2 )
        Extra_MmFixedEntryRecycle( p->pMmCuts, (char *)pCut );
    Vec_PtrWriteEntry( p->vCutsNew, Node, pList );
}